

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O1

void google::LogDestination::SetLogDestination(LogSeverity severity,char *base_filename)

{
  long lVar1;
  char *pcVar2;
  int iVar3;
  LogDestination *this;
  MutexLock l;
  MutexLock local_38;
  MutexLock local_30;
  
  local_38.mu_ = (Mutex *)log_mutex;
  if (log_mutex[0x38] == '\x01') {
    iVar3 = pthread_rwlock_wrlock((pthread_rwlock_t *)log_mutex);
    if (iVar3 != 0) goto LAB_0011736b;
  }
  if ((&log_destinations_)[severity] == 0) {
    this = (LogDestination *)operator_new(0xe0);
    LogDestination(this,severity,(char *)0x0);
    (&log_destinations_)[severity] = this;
  }
  lVar1 = (&log_destinations_)[severity];
  local_30.mu_ = (Mutex *)(lVar1 + 8);
  if (*(char *)(lVar1 + 0x40) == '\x01') {
    iVar3 = pthread_rwlock_wrlock((pthread_rwlock_t *)local_30.mu_);
    if (iVar3 != 0) {
LAB_0011736b:
      abort();
    }
  }
  *(undefined1 *)(lVar1 + 0x48) = 1;
  iVar3 = std::__cxx11::string::compare((char *)(lVar1 + 0x50));
  if (iVar3 != 0) {
    if (*(FILE **)(lVar1 + 0xb0) != (FILE *)0x0) {
      fclose(*(FILE **)(lVar1 + 0xb0));
      *(undefined8 *)(lVar1 + 0xb0) = 0;
      *(undefined4 *)(lVar1 + 200) = 0x1f;
    }
    pcVar2 = *(char **)(lVar1 + 0x58);
    strlen(base_filename);
    std::__cxx11::string::_M_replace((ulong)(lVar1 + 0x50),0,pcVar2,(ulong)base_filename);
  }
  ::glog_internal_namespace_::MutexLock::~MutexLock(&local_30);
  ::glog_internal_namespace_::MutexLock::~MutexLock(&local_38);
  return;
}

Assistant:

inline void LogDestination::SetLogDestination(LogSeverity severity,
					      const char* base_filename) {
  assert(severity >= 0 && severity < NUM_SEVERITIES);
  // Prevent any subtle race conditions by wrapping a mutex lock around
  // all this stuff.
  MutexLock l(&log_mutex);
  log_destination(severity)->fileobject_.SetBasename(base_filename);
}